

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

MemberSyntax * __thiscall
slang::parsing::Parser::parseModule
          (Parser *this,AttrList attributes,SyntaxKind parentKind,bool *anyLocalModules)

{
  size_t *psVar1;
  group_type_pointer pgVar2;
  group_type_pointer pgVar3;
  undefined4 uVar4;
  group_type_pointer pgVar5;
  value_type_pointer ppVar6;
  pointer puVar7;
  size_type sVar8;
  value_type_pointer pbVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  undefined8 __n;
  bool bVar12;
  TokenKind kind;
  SyntaxKind parentKind_00;
  int iVar13;
  AnonymousProgramSyntax *pAVar14;
  ModuleHeaderSyntax *pMVar15;
  Diagnostic *this_00;
  SourceLocation SVar16;
  undefined4 extraout_var;
  NamedBlockClauseSyntax *endBlock;
  ModuleDeclarationSyntax *pMVar17;
  ulong uVar18;
  SyntaxNode *pSVar19;
  ulong uVar20;
  uint uVar22;
  long lVar21;
  Token *pTVar23;
  group_type_pointer pgVar24;
  ulong hash;
  TokenKind kind_00;
  ulong uVar25;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *this_01;
  pointer puVar26;
  byte bVar27;
  byte bVar28;
  uchar uVar29;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  undefined1 auVar30 [16];
  uchar uVar35;
  uchar uVar36;
  uchar uVar37;
  uchar uVar38;
  uchar uVar39;
  uchar uVar40;
  uchar uVar41;
  uchar uVar42;
  uchar uVar43;
  uchar uVar44;
  uchar uVar45;
  undefined1 auVar34 [16];
  uchar uVar46;
  Token TVar47;
  SourceRange range;
  string_view arg;
  bool anyLocalModules_1;
  MemberSyntax *member;
  string_view name;
  Token endmodule;
  locator res;
  bool local_171;
  Token *local_170;
  _Storage<slang::TimeScale,_true> local_168;
  bool local_164;
  long local_160;
  Token *local_158;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *local_150;
  Preprocessor *local_148;
  MemberSyntax *local_140;
  ulong local_138;
  pointer local_130;
  uint64_t local_128;
  ModuleHeaderSyntax *local_120;
  undefined1 local_118 [16];
  ulong local_100;
  group_type_pointer local_f8;
  ulong local_f0;
  ulong local_e8;
  pointer local_e0;
  size_t local_d8;
  undefined1 local_d0 [16];
  SyntaxNode *local_c0;
  SyntaxNode *pSStack_b8;
  pointer local_a8;
  Token local_98;
  undefined1 local_88 [32];
  size_t local_68;
  pointer local_60;
  __extent_storage<18446744073709551615UL> local_58;
  
  bVar12 = ParserBase::peek(&this->super_ParserBase,ProgramKeyword);
  if ((bVar12) && (TVar47 = ParserBase::peek(&this->super_ParserBase,1), TVar47.kind == Semicolon))
  {
    pAVar14 = parseAnonymousProgram(this,attributes);
    return &pAVar14->super_MemberSyntax;
  }
  local_148 = (this->super_ParserBase).window.tokenSource;
  local_148->designElementDepth = local_148->designElementDepth + 1;
  local_e0 = attributes._M_ptr;
  local_d8 = attributes._M_extent._M_extent_value._M_extent_value;
  pMVar15 = parseModuleHeader(this);
  kind = slang::syntax::SyntaxFacts::getModuleEndKind((pMVar15->moduleKeyword).kind);
  local_120 = pMVar15;
  if ((parentKind != CompilationUnit) &&
     (local_d0 = (undefined1  [16])Token::valueText(&pMVar15->name), local_d0._0_8_ != 0)) {
    if (*anyLocalModules == false) {
      SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      ::emplace_back<>(&(this->moduleDeclStack).
                        super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                      );
      *anyLocalModules = true;
    }
    puVar7 = (this->moduleDeclStack).
             super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
             .data_;
    sVar8 = (this->moduleDeclStack).
            super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            .len;
    puVar26 = puVar7 + sVar8;
    this_01 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
              (puVar7 + (sVar8 - 1));
    local_128 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                          (this_01,(basic_string_view<char,_std::char_traits<char>_> *)local_d0);
    uVar25 = local_128 >> ((byte)*this_01 & 0x3f);
    pgVar24 = puVar7[sVar8 - 1].table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
              .arrays.groups_;
    lVar21 = (local_128 & 0xff) * 4;
    uVar29 = (&UNK_0049b57c)[lVar21];
    uVar31 = (&UNK_0049b57d)[lVar21];
    uVar32 = (&UNK_0049b57e)[lVar21];
    uVar33 = (&UNK_0049b57f)[lVar21];
    __n = local_d0._0_8_;
    local_158 = (Token *)local_d0._8_8_;
    uVar20 = (ulong)((uint)local_128 & 7);
    local_138 = 0;
    uVar35 = uVar29;
    uVar36 = uVar31;
    uVar37 = uVar32;
    uVar38 = uVar33;
    uVar39 = uVar29;
    uVar40 = uVar31;
    uVar41 = uVar32;
    uVar42 = uVar33;
    uVar43 = uVar29;
    uVar44 = uVar31;
    uVar45 = uVar32;
    uVar46 = uVar33;
    local_150 = this_01;
    local_e8 = uVar25;
    do {
      local_160 = uVar25 * 0x10;
      pgVar3 = pgVar24 + uVar25;
      auVar30[0] = -(pgVar3->m[0].n == uVar29);
      auVar30[1] = -(pgVar3->m[1].n == uVar31);
      auVar30[2] = -(pgVar3->m[2].n == uVar32);
      auVar30[3] = -(pgVar3->m[3].n == uVar33);
      auVar30[4] = -(pgVar3->m[4].n == uVar35);
      auVar30[5] = -(pgVar3->m[5].n == uVar36);
      auVar30[6] = -(pgVar3->m[6].n == uVar37);
      auVar30[7] = -(pgVar3->m[7].n == uVar38);
      auVar30[8] = -(pgVar3->m[8].n == uVar39);
      auVar30[9] = -(pgVar3->m[9].n == uVar40);
      auVar30[10] = -(pgVar3->m[10].n == uVar41);
      auVar30[0xb] = -(pgVar3->m[0xb].n == uVar42);
      auVar30[0xc] = -(pgVar3->m[0xc].n == uVar43);
      auVar30[0xd] = -(pgVar3->m[0xd].n == uVar44);
      auVar30[0xe] = -(pgVar3->m[0xe].n == uVar45);
      auVar30[0xf] = -(pgVar3->m[0xf].n == uVar46);
      uVar22 = (uint)(ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe);
      local_f0 = uVar25;
      if (uVar22 != 0) {
        pbVar9 = puVar26[-1].table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                 .arrays.elements_;
        local_118[1] = uVar31;
        local_118[0] = uVar29;
        local_118[2] = uVar32;
        local_118[3] = uVar33;
        local_118[4] = uVar35;
        local_118[5] = uVar36;
        local_118[6] = uVar37;
        local_118[7] = uVar38;
        local_118[8] = uVar39;
        local_118[9] = uVar40;
        local_118[10] = uVar41;
        local_118[0xb] = uVar42;
        local_118[0xc] = uVar43;
        local_118[0xd] = uVar44;
        local_118[0xe] = uVar45;
        local_118[0xf] = uVar46;
        local_130 = puVar26;
        local_100 = uVar20;
        local_f8 = pgVar24;
        do {
          iVar13 = 0;
          if (uVar22 != 0) {
            for (; (uVar22 >> iVar13 & 1) == 0; iVar13 = iVar13 + 1) {
            }
          }
          bVar12 = (SyntaxNode *)__n ==
                   *(SyntaxNode **)((long)&pbVar9[uVar25 * 0xf]._M_len + (ulong)(uint)(iVar13 << 4))
          ;
          lVar21 = (long)&pbVar9[uVar25 * 0xf]._M_len + (ulong)(uint)(iVar13 << 4);
          pTVar23 = (Token *)(ulong)uVar22;
          if (bVar12 && (SyntaxNode *)__n != (SyntaxNode *)0x0) {
            local_170 = (Token *)(ulong)uVar22;
            iVar13 = bcmp(local_158,*(void **)(lVar21 + 8),__n);
            bVar12 = iVar13 == 0;
            pTVar23 = local_170;
            uVar29 = local_118[0];
            uVar31 = local_118[1];
            uVar32 = local_118[2];
            uVar33 = local_118[3];
            uVar35 = local_118[4];
            uVar36 = local_118[5];
            uVar37 = local_118[6];
            uVar38 = local_118[7];
            uVar39 = local_118[8];
            uVar40 = local_118[9];
            uVar41 = local_118[10];
            uVar42 = local_118[0xb];
            uVar43 = local_118[0xc];
            uVar44 = local_118[0xd];
            uVar45 = local_118[0xe];
            uVar46 = local_118[0xf];
          }
          puVar26 = local_130;
          if (bVar12) goto LAB_003bd599;
          uVar22 = (uint)pTVar23 - 1 & (uint)pTVar23;
          uVar20 = local_100;
          pgVar24 = local_f8;
        } while (uVar22 != 0);
      }
      if ((pgVar24->m[local_160 + 0xf].n &
          (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed(unsigned_long)::shift)[uVar20]) == 0) break;
      uVar18 = puVar26[-1].table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
               .arrays.groups_size_mask;
      lVar21 = local_f0 + local_138;
      local_138 = local_138 + 1;
      uVar25 = lVar21 + 1U & uVar18;
    } while (local_138 <= uVar18);
    lVar21 = 0;
LAB_003bd599:
    pMVar15 = local_120;
    if (lVar21 == 0) {
      if (puVar26[-1].table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
          .size_ctrl.size <
          puVar26[-1].table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
          .size_ctrl.ml) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::nosize_unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>&>
                  ((locator *)local_88,
                   (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)local_150,(arrays_type *)local_150,local_e8,local_128,
                   (basic_string_view<char,_std::char_traits<char>_> *)local_d0);
        psVar1 = &puVar26[-1].table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                  .size_ctrl.size;
        *psVar1 = *psVar1 + 1;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>&>
                  ((locator *)local_88,
                   (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)local_150,local_128,
                   (basic_string_view<char,_std::char_traits<char>_> *)local_d0);
      }
    }
  }
  parentKind_00 =
       slang::syntax::SyntaxFacts::getModuleDeclarationKind((pMVar15->moduleKeyword).kind);
  uVar22._0_2_ = local_148->defaultNetType;
  uVar22._2_2_ = local_148->unconnectedDrive;
  local_118 = ZEXT416(uVar22);
  local_160 = CONCAT71(local_160._1_7_,local_148->cellDefine);
  local_164 = (local_148->activeTimeScale).super__Optional_base<slang::TimeScale,_true,_true>.
              _M_payload.super__Optional_payload_base<slang::TimeScale>._M_engaged;
  local_168 = (local_148->activeTimeScale).super__Optional_base<slang::TimeScale,_true,_true>.
              _M_payload.super__Optional_payload_base<slang::TimeScale>._M_payload;
  local_150 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
              CONCAT44(local_150._4_4_,this->currentDefinitionKind);
  this->currentDefinitionKind = parentKind_00;
  Token::Token(&local_98);
  local_88._0_8_ = local_88 + 0x18;
  local_88._8_8_ = 0;
  local_88._16_8_ = (SyntaxNode *)0x8;
  local_171 = false;
  local_170 = &(this->super_ParserBase).lastPoppedDelims.first;
  local_158 = &(this->super_ParserBase).lastPoppedDelims.second;
  bVar27 = 0;
  do {
    TVar47 = ParserBase::peek(&this->super_ParserBase);
    kind_00 = TVar47.kind;
    if (kind != kind_00 && kind_00 != EndOfFile) {
      local_140 = parseMember(this,parentKind_00,&local_171);
      if (local_140 == (MemberSyntax *)0x0) {
        bVar12 = slang::syntax::SyntaxFacts::isCloseDelimOrKeyword(kind_00);
        if (bVar12) {
          local_d0 = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
          range = Token::range((Token *)local_d0);
          this_00 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xb80005,range);
          local_d0 = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
          arg = Token::valueText((Token *)local_d0);
          Diagnostic::operator<<(this_00,arg);
          bVar27 = 1;
          if (((this->super_ParserBase).lastPoppedDelims.first.info != (Info *)0x0) &&
             ((this->super_ParserBase).lastPoppedDelims.second.info != (Info *)0x0)) {
            SVar16 = Token::location(local_170);
            Diagnostic::addNote(this_00,(DiagCode)0xc10005,SVar16);
            SVar16 = Token::location(local_158);
            Diagnostic::addNote(this_00,(DiagCode)0xc00005,SVar16);
          }
        }
        bVar28 = ~bVar27;
        bVar27 = 1;
        ParserBase::skipToken
                  (&this->super_ParserBase,
                   (optional<slang::DiagCode>)((uint6)(bVar28 & 1) << 0x20 | 0x450005));
      }
      else {
        checkMemberAllowed(this,&local_140->super_SyntaxNode,parentKind_00);
        SmallVectorBase<slang::syntax::MemberSyntax*>::
        emplace_back<slang::syntax::MemberSyntax*const&>
                  ((SmallVectorBase<slang::syntax::MemberSyntax*> *)local_88,&local_140);
        pSVar19 = this->previewNode;
        this->previewNode = (SyntaxNode *)0x0;
        (local_140->super_SyntaxNode).previewNode = pSVar19;
        bVar27 = 0;
      }
    }
  } while (kind != kind_00 && kind_00 != EndOfFile);
  if (local_171 == true) {
    SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::pop_back(&(this->moduleDeclStack).
                super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              );
  }
  local_98 = ParserBase::expect(&this->super_ParserBase,kind);
  iVar13 = SmallVectorBase<slang::syntax::MemberSyntax_*>::copy
                     ((SmallVectorBase<slang::syntax::MemberSyntax_*> *)local_88,
                      (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)local_98.info);
  if ((group15<boost::unordered::detail::foa::plain_integral> *)local_88._0_8_ !=
      (group15<boost::unordered::detail::foa::plain_integral> *)(local_88 + 0x18)) {
    operator_delete((void *)local_88._0_8_);
  }
  this->currentDefinitionKind = (SyntaxKind)local_150;
  local_148->designElementDepth = local_148->designElementDepth + -1;
  endBlock = parseNamedBlockClause(this);
  pMVar15 = local_120;
  TVar47.kind = (local_120->name).kind;
  TVar47._2_1_ = (local_120->name).field_0x2;
  TVar47.numFlags.raw = (local_120->name).numFlags.raw;
  TVar47.rawLen = (local_120->name).rawLen;
  TVar47.info = (local_120->name).info;
  checkBlockNames(this,TVar47,endBlock);
  local_88._8_4_ = 1;
  local_88._16_8_ = (SyntaxNode *)0x0;
  local_88[0x18] = '\0';
  local_88[0x19] = '\0';
  local_88[0x1a] = '\0';
  local_88[0x1b] = '\0';
  local_88[0x1c] = '\0';
  local_88[0x1d] = '\0';
  local_88[0x1e] = '\0';
  local_88[0x1f] = '\0';
  local_68 = local_d8;
  local_60 = local_e0;
  local_58._M_extent_value = local_d8;
  local_88._0_8_ = &PTR_getChild_005e5c48;
  local_d0._8_4_ = 1;
  local_c0 = (SyntaxNode *)0x0;
  pSStack_b8 = (SyntaxNode *)0x0;
  local_d0._0_8_ = &PTR_getChild_005e5d38;
  local_a8 = (pointer)CONCAT44(extraout_var,iVar13);
  pMVar17 = slang::syntax::SyntaxFactory::moduleDeclaration
                      (&this->factory,parentKind_00,
                       (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_88,pMVar15,
                       (SyntaxList<slang::syntax::MemberSyntax> *)local_d0,local_98,endBlock);
  local_170 = (Token *)&this->meta;
  local_d0._0_8_ = pMVar17;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = pMVar17;
  hash = SUB168(auVar11 * ZEXT816(0x9e3779b97f4a7c15),8) ^
         SUB168(auVar11 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar18 = hash >> ((byte)(this->meta).nodeMap.table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
                          .arrays.groups_size_index & 0x3f);
  pgVar5 = (this->meta).nodeMap.table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
           .arrays.groups_;
  uVar4 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[hash & 0xff];
  ppVar6 = (this->meta).nodeMap.table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
           .arrays.elements_;
  local_158 = (Token *)(this->meta).nodeMap.table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
                       .arrays.groups_size_mask;
  uVar20 = 0;
  uVar25 = uVar18;
  do {
    local_148 = (Preprocessor *)uVar20;
    pgVar2 = pgVar5 + uVar25;
    uVar29 = (uchar)uVar4;
    auVar34[0] = -(pgVar2->m[0].n == uVar29);
    uVar31 = (uchar)((uint)uVar4 >> 8);
    auVar34[1] = -(pgVar2->m[1].n == uVar31);
    uVar32 = (uchar)((uint)uVar4 >> 0x10);
    auVar34[2] = -(pgVar2->m[2].n == uVar32);
    uVar33 = (uchar)((uint)uVar4 >> 0x18);
    auVar34[3] = -(pgVar2->m[3].n == uVar33);
    auVar34[4] = -(pgVar2->m[4].n == uVar29);
    auVar34[5] = -(pgVar2->m[5].n == uVar31);
    auVar34[6] = -(pgVar2->m[6].n == uVar32);
    auVar34[7] = -(pgVar2->m[7].n == uVar33);
    auVar34[8] = -(pgVar2->m[8].n == uVar29);
    auVar34[9] = -(pgVar2->m[9].n == uVar31);
    auVar34[10] = -(pgVar2->m[10].n == uVar32);
    auVar34[0xb] = -(pgVar2->m[0xb].n == uVar33);
    auVar34[0xc] = -(pgVar2->m[0xc].n == uVar29);
    auVar34[0xd] = -(pgVar2->m[0xd].n == uVar31);
    auVar34[0xe] = -(pgVar2->m[0xe].n == uVar32);
    auVar34[0xf] = -(pgVar2->m[0xf].n == uVar33);
    for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar34 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe); uVar22 != 0;
        uVar22 = uVar22 - 1 & uVar22) {
      uVar10 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
        }
      }
      if (pMVar17 == (ModuleDeclarationSyntax *)ppVar6[uVar25 * 0xf + (ulong)uVar10].first) {
        pSVar19 = (SyntaxNode *)(ppVar6 + uVar25 * 0xf + (ulong)uVar10);
        goto LAB_003bd350;
      }
    }
    if ((pgVar5[uVar25].m[0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7]) == 0) break;
    uVar25 = uVar25 + (long)local_148 + 1 & (ulong)local_158;
    uVar20 = (long)local_148 + 1U;
  } while ((long)local_148 + 1U <= local_158);
  pSVar19 = (SyntaxNode *)0x0;
LAB_003bd350:
  bVar12 = local_160._0_1_;
  if (pSVar19 == (SyntaxNode *)0x0) {
    if ((this->meta).nodeMap.table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
        .size_ctrl.size <
        (this->meta).nodeMap.table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::parsing::ParserMetadata::Node>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                ((locator *)local_88,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::parsing::ParserMetadata::Node>>>
                  *)local_170,(arrays_type *)local_170,uVar18,hash,(try_emplace_args_t *)&local_140,
                 (SyntaxNode **)local_d0);
      psVar1 = &(this->meta).nodeMap.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
      pSVar19 = (SyntaxNode *)local_88._16_8_;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::parsing::ParserMetadata::Node>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                ((locator *)local_88,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::parsing::ParserMetadata::Node>>>
                  *)local_170,hash,(try_emplace_args_t *)&local_140,(SyntaxNode **)local_d0);
      pSVar19 = (SyntaxNode *)local_88._16_8_;
    }
  }
  *(TokenKind *)&pSVar19->parent = local_118._0_2_;
  *(undefined2 *)((long)&pSVar19->parent + 2) = local_118._2_2_;
  ((Node *)&pSVar19->parent)->cellDefine = bVar12;
  (((Node *)&pSVar19->parent)->timeScale).super__Optional_base<slang::TimeScale,_true,_true>.
  _M_payload.super__Optional_payload_base<slang::TimeScale>._M_payload = local_168;
  *(bool *)((long)&pSVar19->previewNode + 1) = local_164;
  return &pMVar17->super_MemberSyntax;
}

Assistant:

MemberSyntax& Parser::parseModule(AttrList attributes, SyntaxKind parentKind,
                                  bool& anyLocalModules) {
    if (peek(TokenKind::ProgramKeyword) && peek(1).kind == TokenKind::Semicolon)
        return parseAnonymousProgram(attributes);

    // Tell the preprocessor that we're inside a design element for the duration of this function.
    auto& pp = getPP();
    pp.pushDesignElementStack();

    auto& header = parseModuleHeader();
    auto endKind = getModuleEndKind(header.moduleKeyword.kind);

    // If the parent isn't a compilation unit, that means we're a nested definition.
    // Record our name in the decl stack so that child instantiations know they're
    // referencing a local module and not a global one.
    if (parentKind != SyntaxKind::CompilationUnit) {
        auto name = header.name.valueText();
        if (!name.empty()) {
            if (!anyLocalModules) {
                moduleDeclStack.emplace_back();
                anyLocalModules = true;
            }
            moduleDeclStack.back().emplace(name);
        }
    }

    SyntaxKind declKind = getModuleDeclarationKind(header.moduleKeyword.kind);
    ParserMetadata::Node node{pp.getDefaultNetType(), pp.getUnconnectedDrive(), pp.getCellDefine(),
                              pp.getTimeScale()};

    auto savedDefinitionKind = currentDefinitionKind;
    currentDefinitionKind = declKind;

    Token endmodule;
    auto members = parseMemberList<MemberSyntax>(
        endKind, endmodule, declKind, [this](SyntaxKind parentKind, bool& anyLocalModules) {
            return parseMember(parentKind, anyLocalModules);
        });

    currentDefinitionKind = savedDefinitionKind;
    pp.popDesignElementStack();

    auto endName = parseNamedBlockClause();
    checkBlockNames(header.name, endName);

    auto& result = factory.moduleDeclaration(declKind, attributes, header, members, endmodule,
                                             endName);

    meta.nodeMap[&result] = node;
    return result;
}